

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O3

Image<float,_gimage::PixelTraits<float>_> *
gimage::downscaleImage<float>
          (Image<float,_gimage::PixelTraits<float>_> *__return_storage_ptr__,
          Image<float,_gimage::PixelTraits<float>_> *image,int factor)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float ***pppfVar5;
  float ***pppfVar6;
  float ***pppfVar7;
  int kk;
  ulong uVar8;
  ulong uVar9;
  int n;
  long lVar10;
  int kk_1;
  int iVar11;
  long lVar12;
  ulong uVar13;
  float *pfVar14;
  float fVar15;
  float *pfVar16;
  ulong uVar17;
  int ii;
  float *pfVar18;
  int n_1;
  int iVar19;
  ulong uVar20;
  float fVar21;
  
  if (factor < 2) {
    __return_storage_ptr__->depth = 0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->pixel = (float *)0x0;
    __return_storage_ptr__->row = (float **)0x0;
    __return_storage_ptr__->img = (float ***)0x0;
    Image<float,_gimage::PixelTraits<float>_>::setSize
              (__return_storage_ptr__,image->width,image->height,(long)image->depth);
    memcpy(__return_storage_ptr__->pixel,image->pixel,__return_storage_ptr__->n << 2);
  }
  else {
    uVar20 = (ulong)(uint)factor;
    lVar3 = image->width;
    lVar4 = image->height;
    iVar2 = image->depth;
    __return_storage_ptr__->depth = 0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->pixel = (float *)0x0;
    __return_storage_ptr__->row = (float **)0x0;
    __return_storage_ptr__->img = (float ***)0x0;
    Image<float,_gimage::PixelTraits<float>_>::setSize
              (__return_storage_ptr__,(long)(lVar3 + (uVar20 - 1)) / (long)uVar20,
               (long)((uVar20 - 1) + lVar4) / (long)uVar20,(long)iVar2);
    iVar2 = image->depth;
    if (0 < (long)iVar2) {
      pppfVar5 = __return_storage_ptr__->img;
      lVar3 = image->width;
      lVar4 = image->height;
      pppfVar6 = image->img;
      lVar10 = 0;
      do {
        pfVar16 = *pppfVar5[lVar10];
        if (lVar4 < (long)uVar20) {
          uVar17 = 0;
        }
        else {
          pppfVar7 = image->img;
          uVar8 = uVar20;
          uVar9 = 0;
          do {
            uVar17 = uVar8;
            if (lVar3 < (long)uVar20) {
              uVar13 = 0;
            }
            else {
              pfVar14 = pppfVar7[lVar10][uVar9];
              uVar8 = uVar20;
              do {
                uVar13 = uVar8;
                fVar21 = 0.0;
                iVar19 = 0;
                iVar11 = 0;
                pfVar18 = pfVar14;
                do {
                  uVar8 = 0;
                  do {
                    fVar15 = ABS(pfVar18[uVar8]);
                    if ((uint)fVar15 < 0x7f800000) {
                      fVar21 = fVar21 + pfVar18[uVar8];
                    }
                    iVar11 = iVar11 + (uint)((uint)fVar15 < 0x7f800000);
                    uVar8 = uVar8 + 1;
                  } while (uVar20 != uVar8);
                  iVar19 = iVar19 + 1;
                  pfVar18 = pfVar18 + lVar3;
                } while (iVar19 != factor);
                if (iVar11 < 1) {
                  fVar21 = INFINITY;
                }
                else {
                  fVar21 = fVar21 / (float)iVar11;
                }
                *pfVar16 = fVar21;
                pfVar16 = pfVar16 + 1;
                pfVar14 = pfVar14 + uVar20;
                uVar8 = uVar13 + uVar20;
              } while ((long)(uVar13 + uVar20) <= lVar3);
            }
            if ((long)uVar13 < lVar3) {
              pfVar14 = pppfVar7[lVar10][uVar9] + uVar13;
              fVar21 = 0.0;
              iVar11 = 0;
              iVar19 = 0;
              do {
                uVar8 = 0;
                do {
                  if (lVar3 - uVar13 == uVar8) break;
                  fVar15 = ABS(pfVar14[uVar8]);
                  if ((uint)fVar15 < 0x7f800000) {
                    fVar21 = fVar21 + pfVar14[uVar8];
                  }
                  iVar19 = iVar19 + (uint)((uint)fVar15 < 0x7f800000);
                  uVar8 = uVar8 + 1;
                } while (uVar20 != uVar8);
                iVar11 = iVar11 + 1;
                pfVar14 = pfVar14 + lVar3;
              } while (iVar11 != factor);
              if (iVar19 < 1) {
                fVar21 = INFINITY;
              }
              else {
                fVar21 = fVar21 / (float)iVar19;
              }
              *pfVar16 = fVar21;
              pfVar16 = pfVar16 + 1;
            }
            uVar8 = uVar17 + uVar20;
            uVar9 = uVar17;
          } while ((long)(uVar17 + uVar20) <= lVar4);
        }
        if ((long)uVar17 < lVar4 && 0 < lVar3) {
          pfVar14 = pppfVar6[lVar10][uVar17];
          lVar12 = 0;
          do {
            fVar21 = 0.0;
            iVar19 = 0;
            uVar8 = 0;
            pfVar18 = pfVar14;
            do {
              uVar9 = 0;
              do {
                if (lVar3 <= (long)(lVar12 + uVar9)) break;
                fVar15 = ABS(pfVar18[uVar9]);
                if ((uint)fVar15 < 0x7f800000) {
                  fVar21 = fVar21 + pfVar18[uVar9];
                }
                iVar19 = iVar19 + (uint)((uint)fVar15 < 0x7f800000);
                uVar9 = uVar9 + 1;
              } while (uVar20 != uVar9);
            } while ((uVar8 + 1 < uVar20) &&
                    (pfVar18 = pfVar18 + lVar3, lVar1 = uVar17 + uVar8, uVar8 = uVar8 + 1,
                    lVar1 + 1 < lVar4));
            if (iVar19 < 1) {
              fVar21 = INFINITY;
            }
            else {
              fVar21 = fVar21 / (float)iVar19;
            }
            *pfVar16 = fVar21;
            pfVar16 = pfVar16 + 1;
            lVar12 = lVar12 + uVar20;
            pfVar14 = pfVar14 + uVar20;
          } while (lVar12 < lVar3);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != iVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Image<float> downscaleImage(const Image<float> &image, int factor)
{
  factor=std::max(1, factor);

  if (factor == 1)
  {
    return image;
  }

  Image<float> ret((image.getWidth()+factor-1)/factor,
                   (image.getHeight()+factor-1)/factor, image.getDepth());

  for (int d=0; d<image.getDepth(); d++)
  {
    float *out=ret.getPtr(0, 0, d);

    long k=0;

    while (k+factor <= image.getHeight())
    {
      long i=0;

      // average over factor*factor pixels of the input image

      while (i+factor <= image.getWidth())
      {
        typename Image<float>::work_t v=0;
        int n=0;

        const float *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor; ii++)
          {
            if (image.isValidS(in[ii]))
            {
              v+=in[ii];
              n++;
            }
          }

          in+=image.getWidth();
        }

        if (n > 0)
        {
          *out++=static_cast<typename Image<float>::store_t>(v/n);
        }
        else
        {
          *out++=PixelTraits<float>::invalid();
        }

        i+=factor;
      }

      // if there are less than factor pixels left in the image row, then
      // average with boundary check

      if (i < image.getWidth())
      {
        typename Image<float>::work_t v=0;
        int n=0;

        const float *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValidS(in[ii]))
            {
              v+=in[ii];
              n++;
            }
          }

          in+=image.getWidth();
        }

        if (n > 0)
        {
          *out++=static_cast<typename Image<float>::store_t>(v/n);
        }
        else
        {
          *out++=PixelTraits<float>::invalid();
        }
      }

      k+=factor;
    }

    // if there are less than factor image rows left in the image, then
    // average with boundary check

    if (k < image.getHeight())
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        typename Image<float>::work_t v=0;
        int n=0;

        const float *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValidS(in[ii]))
            {
              v+=in[ii];
              n++;
            }
          }

          in+=image.getWidth();
        }

        if (n > 0)
        {
          *out++=static_cast<typename Image<float>::store_t>(v/n);
        }
        else
        {
          *out++=PixelTraits<float>::invalid();
        }
      }
    }
  }

  return ret;
}